

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.cpp
# Opt level: O0

bool __thiscall CaseInsensitiveLess::operator()(CaseInsensitiveLess *this,string *s1,string *s2)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  string *s2_local;
  string *s1_local;
  CaseInsensitiveLess *this_local;
  
  iVar2 = std::begin<std::__cxx11::string>(s1);
  iVar3 = std::end<std::__cxx11::string>(s1);
  std::operator()(iVar2._M_current,iVar3._M_current);
  iVar2 = std::begin<std::__cxx11::string>(s2);
  iVar3 = std::end<std::__cxx11::string>(s2);
  std::operator()(iVar2._M_current,iVar3._M_current);
  bVar1 = std::operator<(s1,s2);
  return bVar1;
}

Assistant:

bool operator() (std::string s1, std::string s2) const {
        std::for_each(std::begin(s1), std::end(s1), [](char& c){
            c = std::tolower(c);
        });
        std::for_each(std::begin(s2), std::end(s2), [](char& c){
            c = std::tolower(c);
        });
        return s1 < s2;
    }